

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef llvm::Triple::getArchTypePrefix(ArchType Kind)

{
  undefined1 auStack_1c8 [4];
  ArchType Kind_local;
  char *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  char *local_188;
  undefined1 *local_180;
  char *local_178;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  char *local_138;
  undefined1 *local_130;
  char *local_128;
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case arm:
  case armeb:
  case thumb:
  case thumbeb:
    local_190 = auStack_1c8;
    local_198 = "arm";
    strlen("arm");
    break;
  case aarch64:
  case aarch64_be:
    local_1b0 = auStack_1c8;
    local_1b8 = "aarch64";
    strlen("aarch64");
    break;
  case arc:
    local_1a0 = auStack_1c8;
    local_1a8 = "arc";
    strlen("arc");
    break;
  case avr:
    local_180 = auStack_1c8;
    local_188 = "avr";
    strlen("avr");
    break;
  case bpfel:
  case bpfeb:
    local_110 = auStack_1c8;
    local_118 = "bpf";
    strlen("bpf");
    break;
  case hexagon:
    local_140 = auStack_1c8;
    local_148 = "hexagon";
    strlen("hexagon");
    break;
  case mips:
  case mipsel:
  case mips64:
  case mips64el:
    local_160 = auStack_1c8;
    local_168 = "mips";
    strlen("mips");
    break;
  default:
    memset(auStack_1c8,0,0x10);
    StringRef::StringRef((StringRef *)auStack_1c8);
    break;
  case nios2:
    local_150 = auStack_1c8;
    local_158 = "nios2";
    strlen("nios2");
    break;
  case ppc:
  case ppc64:
  case ppc64le:
    local_170 = auStack_1c8;
    local_178 = "ppc";
    strlen("ppc");
    break;
  case r600:
    local_120 = auStack_1c8;
    local_128 = "r600";
    strlen("r600");
    break;
  case amdgcn:
    local_130 = auStack_1c8;
    local_138 = "amdgcn";
    strlen("amdgcn");
    break;
  case riscv32:
  case riscv64:
    local_10 = auStack_1c8;
    local_18 = "riscv";
    strlen("riscv");
    break;
  case sparc:
  case sparcv9:
  case sparcel:
    local_100 = auStack_1c8;
    local_108 = "sparc";
    strlen("sparc");
    break;
  case systemz:
    local_f0 = auStack_1c8;
    local_f8 = "s390";
    strlen("s390");
    break;
  case x86:
  case x86_64:
    local_e0 = auStack_1c8;
    local_e8 = "x86";
    strlen("x86");
    break;
  case xcore:
    local_d0 = auStack_1c8;
    local_d8 = "xcore";
    strlen("xcore");
    break;
  case nvptx:
    local_c0 = auStack_1c8;
    local_c8 = "nvvm";
    strlen("nvvm");
    break;
  case nvptx64:
    local_b0 = auStack_1c8;
    local_b8 = "nvvm";
    strlen("nvvm");
    break;
  case le32:
    local_a0 = auStack_1c8;
    local_a8 = "le32";
    strlen("le32");
    break;
  case le64:
    local_90 = auStack_1c8;
    local_98 = "le64";
    strlen("le64");
    break;
  case amdil:
  case amdil64:
    local_80 = auStack_1c8;
    local_88 = "amdil";
    strlen("amdil");
    break;
  case hsail:
  case hsail64:
    local_70 = auStack_1c8;
    local_78 = "hsail";
    strlen("hsail");
    break;
  case spir:
  case spir64:
    local_60 = auStack_1c8;
    local_68 = "spir";
    strlen("spir");
    break;
  case kalimba:
    local_50 = auStack_1c8;
    local_58 = "kalimba";
    strlen("kalimba");
    break;
  case shave:
    local_30 = auStack_1c8;
    local_38 = "shave";
    strlen("shave");
    break;
  case lanai:
    local_40 = auStack_1c8;
    local_48 = "lanai";
    strlen("lanai");
    break;
  case wasm32:
  case wasm64:
    local_20 = auStack_1c8;
    local_28 = "wasm";
    strlen("wasm");
  }
  return _auStack_1c8;
}

Assistant:

StringRef Triple::getArchTypePrefix(ArchType Kind) {
  switch (Kind) {
  default:
    return StringRef();

  case aarch64:
  case aarch64_be:  return "aarch64";

  case arc:         return "arc";

  case arm:
  case armeb:
  case thumb:
  case thumbeb:     return "arm";

  case avr:         return "avr";

  case ppc64:
  case ppc64le:
  case ppc:         return "ppc";

  case mips:
  case mipsel:
  case mips64:
  case mips64el:    return "mips";

  case nios2:       return "nios2";

  case hexagon:     return "hexagon";

  case amdgcn:      return "amdgcn";
  case r600:        return "r600";

  case bpfel:
  case bpfeb:       return "bpf";

  case sparcv9:
  case sparcel:
  case sparc:       return "sparc";

  case systemz:     return "s390";

  case x86:
  case x86_64:      return "x86";

  case xcore:       return "xcore";

  // NVPTX intrinsics are namespaced under nvvm.
  case nvptx:       return "nvvm";
  case nvptx64:     return "nvvm";

  case le32:        return "le32";
  case le64:        return "le64";

  case amdil:
  case amdil64:     return "amdil";

  case hsail:
  case hsail64:     return "hsail";

  case spir:
  case spir64:      return "spir";
  case kalimba:     return "kalimba";
  case lanai:       return "lanai";
  case shave:       return "shave";
  case wasm32:
  case wasm64:      return "wasm";

  case riscv32:
  case riscv64:     return "riscv";
  }
}